

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O0

int process_start(char *name,char *part,process_info_t *p,int is_helper)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  char *pcVar4;
  FILE *__stream;
  int *piVar5;
  bool bVar6;
  int local_e4;
  pid_t pid;
  int n;
  ssize_t rc;
  char fdstr [8];
  int pipefd [2];
  char *args [16];
  char *arg;
  int stdout_fd;
  FILE *stdout_file;
  int is_helper_local;
  process_info_t *p_local;
  char *part_local;
  char *name_local;
  
  pcVar4 = getenv("UV_USE_VALGRIND");
  local_e4 = 0;
  if (((is_helper == 0) && (pcVar4 != (char *)0x0)) && (iVar1 = atoi(pcVar4), iVar1 != 0)) {
    args[(long)local_e4 + -1] = "valgrind";
    args[(long)(local_e4 + 1) + -1] = "--quiet";
    args[(long)(local_e4 + 2) + -1] = "--leak-check=full";
    iVar1 = local_e4 + 4;
    args[(long)(local_e4 + 3) + -1] = "--show-reachable=yes";
    local_e4 = local_e4 + 5;
    args[(long)iVar1 + -1] = "--error-exitcode=125";
  }
  args[(long)local_e4 + -1] = executable_path;
  args[(long)(local_e4 + 1) + -1] = name;
  iVar1 = local_e4 + 3;
  args[(long)(local_e4 + 2) + -1] = part;
  local_e4 = local_e4 + 4;
  args[(long)iVar1 + -1] = (char *)0x0;
  __stream = tmpfile64();
  iVar1 = fileno(__stream);
  if (__stream == (FILE *)0x0) {
    perror("tmpfile");
    return -1;
  }
  if (is_helper != 0) {
    iVar2 = pipe((int *)fdstr);
    if (iVar2 != 0) {
      perror("pipe");
      return -1;
    }
    snprintf((char *)&rc,8,"%d",(ulong)(uint)fdstr._4_4_);
    iVar2 = setenv("UV_TEST_RUNNER_FD",(char *)&rc,1);
    if (iVar2 != 0) {
      perror("setenv");
      return -1;
    }
  }
  p->terminated = 0;
  p->status = 0;
  _Var3 = fork();
  if (_Var3 < 0) {
    perror("fork");
    name_local._4_4_ = -1;
  }
  else {
    if (_Var3 == 0) {
      if (is_helper != 0) {
        closefd(fdstr._0_4_);
      }
      dup2(iVar1,1);
      dup2(iVar1,2);
      execve((char *)pipefd,(char **)pipefd,_environ);
      perror("execve()");
      _exit(0x7f);
    }
    p->pid = _Var3;
    pcVar4 = strdup(name);
    p->name = pcVar4;
    p->stdout_file = (FILE *)__stream;
    if (is_helper == 0) {
      name_local._4_4_ = 0;
    }
    else {
      closefd(fdstr._4_4_);
      unsetenv("UV_TEST_RUNNER_FD");
      do {
        _pid = read(fdstr._0_4_,&local_e4,1);
        bVar6 = false;
        if (_pid == -1) {
          piVar5 = __errno_location();
          bVar6 = *piVar5 == 4;
        }
      } while (bVar6);
      closefd(fdstr._0_4_);
      if (_pid == -1) {
        perror("read");
        name_local._4_4_ = -1;
      }
      else if (_pid < 1) {
        name_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"EOF expected but got data.\n");
        name_local._4_4_ = -1;
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

int process_start(char* name, char* part, process_info_t* p, int is_helper) {
  FILE* stdout_file;
  int stdout_fd;
  const char* arg;
  char* args[16];
  int pipefd[2];
  char fdstr[8];
  ssize_t rc;
  int n;
  pid_t pid;

  arg = getenv("UV_USE_VALGRIND");
  n = 0;

  /* Disable valgrind for helpers, it complains about helpers leaking memory.
   * They're killed after the test and as such never get a chance to clean up.
   */
  if (is_helper == 0 && arg != NULL && atoi(arg) != 0) {
    args[n++] = "valgrind";
    args[n++] = "--quiet";
    args[n++] = "--leak-check=full";
    args[n++] = "--show-reachable=yes";
    args[n++] = "--error-exitcode=125";
  }

  args[n++] = executable_path;
  args[n++] = name;
  args[n++] = part;
  args[n++] = NULL;

  stdout_file = tmpfile();
  stdout_fd = fileno(stdout_file);
  if (!stdout_file) {
    perror("tmpfile");
    return -1;
  }

  if (is_helper) {
    if (pipe(pipefd)) {
      perror("pipe");
      return -1;
    }

    snprintf(fdstr, sizeof(fdstr), "%d", pipefd[1]);
    if (setenv("UV_TEST_RUNNER_FD", fdstr, /* overwrite */ 1)) {
      perror("setenv");
      return -1;
    }
  }

  p->terminated = 0;
  p->status = 0;

  pid = fork();

  if (pid < 0) {
    perror("fork");
    return -1;
  }

  if (pid == 0) {
    /* child */
    if (is_helper)
      closefd(pipefd[0]);
    dup2(stdout_fd, STDOUT_FILENO);
    dup2(stdout_fd, STDERR_FILENO);
    execve(args[0], args, environ);
    perror("execve()");
    _exit(127);
  }

  /* parent */
  p->pid = pid;
  p->name = strdup(name);
  p->stdout_file = stdout_file;

  if (!is_helper)
    return 0;

  closefd(pipefd[1]);
  unsetenv("UV_TEST_RUNNER_FD");

  do
    rc = read(pipefd[0], &n, 1);
  while (rc == -1 && errno == EINTR);

  closefd(pipefd[0]);

  if (rc == -1) {
    perror("read");
    return -1;
  }

  if (rc > 0) {
    fprintf(stderr, "EOF expected but got data.\n");
    return -1;
  }

  return 0;
}